

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional1.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  Foo foo;
  function<void_(int)> f_display_obj;
  function<void_(int)> f_display;
  function<void_()> f_display_42;
  function<void_(int)> nullfun;
  undefined8 uStack_150;
  int local_140;
  char local_139;
  char local_138 [16];
  code *local_128;
  code *local_120;
  undefined8 *local_118;
  undefined8 local_110;
  code *local_108;
  code *local_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  code *local_e8;
  code *local_e0;
  code *local_d8;
  undefined8 local_d0;
  code *local_c8;
  code *local_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  char local_98 [16];
  code *local_88;
  code *local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  char local_38 [16];
  code *local_28;
  undefined8 uStack_20;
  
  local_70 = 0;
  local_78 = print_num;
  local_60 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  local_68 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  uStack_150 = 0x1022a7;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-9);
  local_38[0] = 10;
  uStack_150 = 0x1022bf;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_38,1);
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  uStack_150 = 0x1022ed;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"HenryDbg::tp2----->",0x13);
  uStack_150 = 0x102301;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  uStack_150 = 0x102310;
  std::ostream::put('x');
  uStack_150 = 0x102318;
  std::ostream::flush();
  local_58 = 0;
  uStack_50 = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iZhangHui[P]cplusplus-11/functional1.cpp:38:39)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iZhangHui[P]cplusplus-11/functional1.cpp:38:39)>
             ::_M_manager;
  uStack_150 = 0x102352;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2a);
  local_b8 = (undefined8 *)CONCAT71(local_b8._1_7_,10);
  uStack_150 = 0x10236a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_b8,1);
  local_b0 = 0;
  uStack_150 = 0x102380;
  local_b8 = (undefined8 *)operator_new(0x10);
  *local_b8 = print_num;
  *(undefined4 *)(local_b8 + 1) = 0x7a69;
  local_a0 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_invoke;
  local_a8 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_manager;
  uStack_150 = 0x1023c1;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x7a69);
  local_d8 = (code *)CONCAT71(local_d8._1_7_,10);
  uStack_150 = 0x1023d6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_d8,1);
  local_d8 = Foo::print_add;
  local_d0 = 0;
  local_c0 = std::_Function_handler<void_(const_Foo_&,_int),_void_(Foo::*)(int)_const>::_M_invoke;
  local_c8 = std::_Function_handler<void_(const_Foo_&,_int),_void_(Foo::*)(int)_const>::_M_manager;
  local_140 = 0x4cb2f;
  uStack_150 = 0x102422;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4cb30);
  local_138[0] = 10;
  uStack_150 = 0x102437;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_138,1);
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[8] = '\0';
  local_138[9] = '\0';
  local_138[10] = '\0';
  local_138[0xb] = '\0';
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  local_120 = std::_Function_handler<int_(const_Foo_&),_int_Foo::*>::_M_invoke;
  local_128 = std::_Function_handler<int_(const_Foo_&),_int_Foo::*>::_M_manager;
  uStack_150 = 0x10246f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"num_: ",6);
  if (local_128 != (code *)0x0) {
    uStack_150 = 0x10248b;
    iVar1 = (*local_120)(local_138,&local_140);
    uStack_150 = 0x102499;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    local_f8 = (undefined8 *)CONCAT71(local_f8._1_7_,10);
    uStack_150 = 0x1024ae;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_f8,1);
    iVar1 = local_140;
    local_f0 = 0;
    uStack_150 = 0x1024c5;
    local_f8 = (undefined8 *)operator_new(0x18);
    *local_f8 = Foo::print_add;
    local_f8[1] = 0;
    *(int *)(local_f8 + 2) = iVar1;
    local_e0 = std::
               _Function_handler<void_(int),_std::_Bind<void_(Foo::*(Foo,_std::_Placeholder<1>))(int)_const>_>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(int),_std::_Bind<void_(Foo::*(Foo,_std::_Placeholder<1>))(int)_const>_>
               ::_M_manager;
    uStack_150 = 0x102501;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1 + 2);
    local_118 = (undefined8 *)CONCAT71(local_118._1_7_,10);
    uStack_150 = 0x102516;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_118,1);
    local_110 = 0;
    uStack_150 = 0x102529;
    local_118 = (undefined8 *)operator_new(0x18);
    *local_118 = Foo::print_add;
    local_118[1] = 0;
    local_118[2] = &local_140;
    local_100 = std::
                _Function_handler<void_(int),_std::_Bind<void_(Foo::*(const_Foo_*,_std::_Placeholder<1>))(int)_const>_>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(int),_std::_Bind<void_(Foo::*(const_Foo_*,_std::_Placeholder<1>))(int)_const>_>
                ::_M_manager;
    uStack_150 = 0x102568;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_140 + 3);
    local_98[0] = 10;
    uStack_150 = 0x102580;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,1);
    local_98[0] = '\0';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    local_80 = std::_Function_handler<void_(int),_PrintNum>::_M_invoke;
    local_88 = std::_Function_handler<void_(int),_PrintNum>::_M_manager;
    uStack_150 = 0x1025ba;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x12);
    local_139 = '\n';
    uStack_150 = 0x1025cf;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_139,1);
    if (local_88 != (code *)0x0) {
      uStack_150 = 0x1025ee;
      (*local_88)(local_98,local_98,3);
    }
    if (local_108 != (code *)0x0) {
      uStack_150 = 0x102607;
      (*local_108)(&local_118,&local_118,3);
    }
    if (local_e8 != (code *)0x0) {
      uStack_150 = 0x102620;
      (*local_e8)(&local_f8,&local_f8,3);
    }
    if (local_128 != (code *)0x0) {
      uStack_150 = 0x102639;
      (*local_128)(local_138,local_138,3);
    }
    if (local_c8 != (code *)0x0) {
      uStack_150 = 0x102655;
      (*local_c8)(&local_d8,&local_d8,3);
    }
    if (local_a8 != (code *)0x0) {
      uStack_150 = 0x102674;
      (*local_a8)(&local_b8,&local_b8,3);
    }
    if (local_48 != (code *)0x0) {
      uStack_150 = 0x102693;
      (*local_48)(&local_58,&local_58,3);
    }
    if (local_28 != (code *)0x0) {
      uStack_150 = 0x1026b2;
      (*local_28)(local_38,local_38,3);
    }
    if (local_68 != (code *)0x0) {
      uStack_150 = 0x1026d1;
      (*local_68)(&local_78,&local_78,3);
    }
    return 0;
  }
  uStack_150 = 0x1026e4;
  uVar3 = std::__throw_bad_function_call();
  uStack_150 = 0x102873;
  uStack_150 = __clang_call_terminate(uVar3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2a);
  uStack_150 = CONCAT17(10,(undefined7)uStack_150);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_150 + 7),1);
  return (int)uStack_150;
}

Assistant:

int main()
{
	// store a free function
	std::function<void(int)> f_display = print_num;
	f_display(-9);

	std::function<void(int)> nullfun;
	if (nullfun) {
		std::cout << "HenryDbg::tp1----->" << std::endl;

	} else {
		std::cout << "HenryDbg::tp2----->" << std::endl;
	}

	// store a lambda
	std::function<void()> f_display_42 = []() { print_num(42); };
	f_display_42();

	// store the result of a call to std::bind
	std::function<void()> f_display_31337 = std::bind(print_num, 31337);
	f_display_31337();

	// store a call to a member function
	std::function<void(const Foo&, int)> f_add_display = &Foo::print_add;
	const Foo foo(314159);
	f_add_display(foo, 1);

	// store a call to a data member accessor
	std::function<int(Foo const&)> f_num = &Foo::num_;
	std::cout << "num_: " << f_num(foo) << '\n';

	// store a call to a member function and object
	using std::placeholders::_1;
	std::function<void(int)> f_add_display2 = std::bind( &Foo::print_add, foo, _1 );
	f_add_display2(2);

	// store a call to a member function and object ptr
	std::function<void(int)> f_add_display3 = std::bind( &Foo::print_add, &foo, _1 );
	f_add_display3(3);

	// store a call to a function object
	std::function<void(int)> f_display_obj = PrintNum();
	f_display_obj(18);
}